

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::evalTexture1DProjGradOffset(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  Texture1D *pTVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  fVar1 = c->in[0].m_data[0];
  fVar2 = c->in[0].m_data[3];
  fVar8 = (float)(c->textures[0].tex1D)->m_width;
  fVar9 = fVar8 * c->in[1].m_data[0];
  fVar8 = fVar8 * c->in[2].m_data[0];
  uVar6 = -(uint)(-fVar9 <= fVar9);
  uVar7 = -(uint)(-fVar8 <= fVar8);
  fVar9 = (float)(~uVar6 & (uint)-fVar9 | (uint)fVar9 & uVar6);
  fVar8 = (float)(~uVar7 & (uint)-fVar8 | (uint)fVar8 & uVar7);
  uVar6 = -(uint)(fVar8 <= fVar9);
  fVar8 = logf((float)(~uVar6 & (uint)fVar8 | (uint)fVar9 & uVar6));
  pTVar3 = c->textures[0].tex1D;
  tcu::sampleLevelArray1DOffset
            ((ConstPixelBufferAccess *)&local_28,(int)(pTVar3->m_view).m_levels,
             (Sampler *)(ulong)(uint)(pTVar3->m_view).m_numLevels,fVar1 / fVar2,fVar8 * 1.442695,
             (IVec2 *)c->textures);
  fVar1 = (p->scale).m_data[1];
  fVar2 = (p->scale).m_data[2];
  fVar8 = (p->scale).m_data[3];
  fVar9 = (p->bias).m_data[1];
  fVar4 = (p->bias).m_data[2];
  fVar5 = (p->bias).m_data[3];
  (c->color).m_data[0] = (p->scale).m_data[0] * local_28 + (p->bias).m_data[0];
  (c->color).m_data[1] = fVar1 * fStack_24 + fVar9;
  (c->color).m_data[2] = fVar2 * fStack_20 + fVar4;
  (c->color).m_data[3] = fVar8 * fStack_1c + fVar5;
  return;
}

Assistant:

static void		evalTexture1DProjGradOffset		(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture1DOffset(c, c.in[0].x()/c.in[0].w(), computeLodFromGrad1D(c), p.offset.x())*p.scale + p.bias; }